

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::initDataOtherTypes(PeleLM *this)

{
  AmrLevel *in_RDI;
  Real in_stack_00000008;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  amrex::AmrLevel::get_new_data(in_RDI,in_stack_ffffffffffffffec);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_RDI,
             (value_type)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  amrex::AmrLevel::get_new_data(in_RDI,in_stack_ffffffffffffffec);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_RDI,
             (value_type)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  amrex::StateData::curTime((StateData *)this);
  setThermoPress(this,in_stack_00000008);
  return;
}

Assistant:

void
PeleLM::initDataOtherTypes ()
{
  // Set initial omegadot = 0
  get_new_data(RhoYdot_Type).setVal(0.0);

  // Put something reasonable into the FuncCount variable
  get_new_data(FuncCount_Type).setVal(1);

  // Fill the thermodynamic pressure into the state
  setThermoPress(state[State_Type].curTime());
}